

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  uchar chan;
  size_type sVar1;
  char *pcVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  ostream *poVar7;
  long *plVar8;
  PortType portType;
  BasePort *Port;
  char *pcVar9;
  int curLine;
  int iVar10;
  int row;
  ulong uVar11;
  string FPGA_SN;
  string stringLine;
  string QLA_SN;
  string logFilename;
  Amp1394Console console;
  string portDescription;
  ofstream logFile;
  stringstream debugStream;
  AmpIO Board;
  BasePort *local_1328;
  uint local_131c;
  ulong local_1318;
  undefined8 local_1310;
  string local_1308;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  undefined7 uStack_12b0;
  undefined4 uStack_12a9;
  undefined1 local_12a5;
  char *local_12a0;
  undefined8 local_1298;
  char local_1290;
  undefined7 uStack_128f;
  string local_1280;
  long *local_1260;
  long local_1258;
  long local_1250 [2];
  Amp1394Console local_1240;
  long *local_1230;
  char *local_1228;
  long local_1220 [2];
  undefined1 local_1210 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1200;
  int aiStack_11f0 [54];
  ios_base local_1118 [264];
  long local_1010 [2];
  ostream local_1000 [8];
  string local_ff8 [8];
  byte abStack_ff0 [96];
  ios_base local_f90 [264];
  undefined1 local_e88 [3672];
  
  BasePort::DefaultPort_abi_cxx11_();
  local_1310 = 0;
  local_1318 = 0;
  if (1 < argc) {
    local_1318 = 0;
    uVar11 = 1;
    local_1310 = 0;
    iVar5 = 0;
    do {
      pcVar2 = local_1228;
      pcVar9 = argv[uVar11];
      if (*pcVar9 == '-') {
        if (pcVar9[1] == 'q') {
          local_1310 = (ulong)((int)pcVar9[2] - 0x30);
        }
        else {
          if (pcVar9[1] != 'p') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Usage: qlatest [<board-num>] [-pP] [-qN]",0x28);
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
            std::ostream::put(-0x28);
            poVar7 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"       where <board-num> = rotary switch setting (0-15, default 0)",
                       0x42);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            poVar7 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"             P = port number (default 0)",0x28);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            poVar7 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"                 can also specify -pfwP, -pethP or -pudp",0x38);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            poVar7 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"             N = QLA number (1 or 2) on DQLA",0x2c);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            iVar5 = 0;
            std::ostream::flush();
            goto LAB_0010a874;
          }
          strlen(pcVar9 + 2);
          std::__cxx11::string::_M_replace((ulong)&local_1230,0,pcVar2,(ulong)(pcVar9 + 2));
        }
      }
      else {
        if (iVar5 == 0) {
          iVar10 = atoi(pcVar9);
          local_1318 = CONCAT44(extraout_var,iVar10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Selecting board ",0x10);
          plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cerr,(int)local_1318);
          std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
          std::ostream::put((char)plVar8);
          std::ostream::flush();
        }
        iVar5 = iVar5 + 1;
      }
      uVar11 = uVar11 + 1;
    } while ((uint)argc != uVar11);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1010,_S_out|_S_in);
  local_1328 = PortFactory((char *)local_1230,local_1000);
  uVar11 = local_1318;
  if (local_1328 == (BasePort *)0x0) {
    PrintDebugStream((stringstream *)local_1010);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to create port using: ",0x1d);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_1230,(long)local_1228);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    iVar5 = -1;
    std::ostream::flush();
    goto LAB_0010a853;
  }
  iVar5 = (*local_1328->_vptr_BasePort[0x11])();
  if ((char)iVar5 == '\0') {
    PrintDebugStream((stringstream *)local_1010);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to initialize ",0x15);
    uVar6 = (*local_1328->_vptr_BasePort[0xf])();
    BasePort::PortTypeString_abi_cxx11_((string *)local_e88,(BasePort *)(ulong)uVar6,portType);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_e88._0_8_,local_e88._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((undefined1 *)local_e88._0_8_ != local_e88 + 0x10) {
      operator_delete((void *)local_e88._0_8_,(ulong)(local_e88._16_8_ + 1));
    }
    iVar5 = -1;
    goto LAB_0010a853;
  }
  local_131c = 0;
  if ((((byte)uVar11 < 0x10) && (local_1328->HardwareVersion[(uint)uVar11 & 0xf] == 0x44514c41)) &&
     (local_131c = (uint)local_1310, 1 < local_131c - 1)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Must specify -q1 or -q2 to select QLA number for DQLA",0x35);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    (*local_1328->_vptr_BasePort[0xb])();
    iVar5 = 0;
    goto LAB_0010a853;
  }
  local_1310 = CONCAT44(local_1310._4_4_,(uint)uVar11) & 0xffffffff000000ff;
  AmpIO::AmpIO((AmpIO *)local_e88,(byte)uVar11);
  (*local_1328->_vptr_BasePort[0xd])(local_1328,local_e88);
  local_1260 = local_1250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1260,"QLA_","");
  chan = (uchar)local_131c;
  AmpIO::GetQLASerialNumber_abi_cxx11_(&local_1280,(AmpIO *)local_e88,(uchar)local_131c);
  if (local_1280._M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"QLA serial number not found. Program now (y/n)? ",0x30);
    uVar6 = getchar();
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    if ((uVar6 & 0xdf) == 0x59) {
      bVar3 = PromQLASerialNumberProgram((AmpIO *)local_e88,chan);
      if (bVar3) {
        AmpIO::GetQLASerialNumber_abi_cxx11_((string *)local_1210,(AmpIO *)local_e88,chan);
        std::__cxx11::string::operator=((string *)&local_1280,(string *)local_1210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1210._0_8_ != &local_1200) {
          operator_delete((void *)local_1210._0_8_,local_1200._M_allocated_capacity + 1);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to program QLA serial number",0x23);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
      }
    }
    if (local_1280._M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_1280,0,(char *)0x0,0x11e025);
    }
  }
  std::__cxx11::string::_M_append((char *)&local_1260,(ulong)local_1280._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&local_1260);
  std::ofstream::ofstream(local_1210,(char *)local_1260,_S_out);
  if (*(int *)((long)aiStack_11f0 + *(long *)(local_1210._0_8_ + -0x18)) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1210,"====== TEST REPORT ======",0x19);
    std::ios::widen((char)(ostream *)local_1210 + (char)*(undefined8 *)(local_1210._0_8_ + -0x18));
    std::ostream::put((char)local_1210);
    plVar8 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    std::ostream::put((char)plVar8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1210,"QLA S/N: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1210,local_1280._M_dataplus._M_p,local_1280._M_string_length);
    if (local_131c != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1210," (QLA ",6);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1210);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," of DQLA)",9);
    }
    std::ios::widen((char)(ostream *)local_1210 + (char)*(undefined8 *)(local_1210._0_8_ + -0x18));
    std::ostream::put((char)local_1210);
    std::ostream::flush();
    uVar6 = BoardIO::GetFpgaVersionMajor((BoardIO *)local_e88);
    if (uVar6 == 3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1210,"FPGA V3",7);
      std::ios::widen((char)(ostream *)local_1210 + (char)*(undefined8 *)(local_1210._0_8_ + -0x18))
      ;
      std::ostream::put((char)local_1210);
      std::ostream::flush();
    }
    else {
      FpgaIO::GetFPGASerialNumber_abi_cxx11_(&local_1308,(FpgaIO *)local_e88);
      if (local_1308._M_string_length == 0) {
        std::__cxx11::string::_M_replace((ulong)&local_1308,0,(char *)0x0,0x11e025);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1210,"FPGA S/N: ",10);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1210,local_1308._M_dataplus._M_p,
                          local_1308._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1308._M_dataplus._M_p != &local_1308.field_2) {
        operator_delete(local_1308._M_dataplus._M_p,local_1308.field_2._M_allocated_capacity + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1210,"FPGA Firmware Version: ",0x17);
    BoardIO::GetFirmwareVersion((BoardIO *)local_e88);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1210);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    local_1240.isOk = false;
    local_1240.noEcho = false;
    local_1240.noBlock = false;
    local_1240.Internals = (ConsoleInternals *)0x0;
    Amp1394Console::Init(&local_1240);
    if (local_1240.isOk == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to initialize console",0x1c);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      iVar5 = -1;
      (*local_1328->_vptr_BasePort[0xe])(local_1328,local_1310 & 0xffffffff);
    }
    else {
      Amp1394Console::Print
                (1,9,"QLA Test for Board %d, S/N %s",uVar11 & 0xffffffff,local_1280._M_dataplus._M_p
                );
      Amp1394Console::Print(3,9,"0) Quit");
      Amp1394Console::Print(4,9,"1) Test digital input:");
      Amp1394Console::Print(5,9,"2) Test encoder feedback:");
      Amp1394Console::Print(6,9,"3) Test analog feedback:");
      Amp1394Console::Print(7,9,"4) Test motor power control:");
      Amp1394Console::Print(8,9,"5) Test power amplifier:");
      iVar5 = (*local_1328->_vptr_BasePort[0xf])();
      if (iVar5 == 0) {
        if (1 < uVar6) goto LAB_0010a15f;
      }
      else {
        iVar5 = (*local_1328->_vptr_BasePort[0xf])();
        if ((1 < uVar6) && (iVar5 == 3)) {
LAB_0010a15f:
          Amp1394Console::Print(9,9,"6) Test Ethernet controller:");
        }
      }
      Amp1394Console::Refresh();
      local_1318 = CONCAT44(local_1318._4_4_,uVar6);
      iVar5 = 0x14;
      bVar3 = false;
      while (!bVar3) {
        std::__cxx11::stringbuf::str();
        sVar1 = local_1308._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1308._M_dataplus._M_p != &local_1308.field_2) {
          operator_delete(local_1308._M_dataplus._M_p,local_1308.field_2._M_allocated_capacity + 1);
        }
        if (sVar1 != 0) {
          local_12c8 = 0x2020202020202020;
          uStack_12c0 = 0x2020202020202020;
          local_12d8 = 0x2020202020202020;
          uStack_12d0 = 0x2020202020202020;
          local_12e8 = 0x2020202020202020;
          uStack_12e0 = 0x2020202020202020;
          local_1308.field_2._M_allocated_capacity = 0x2020202020202020;
          local_1308.field_2._8_8_ = 0x2020202020202020;
          local_1308._M_dataplus._M_p = (char *)0x2020202020202020;
          local_1308._M_string_length = 0x2020202020202020;
          if (0x14 < iVar5) {
            iVar10 = 0x14;
            do {
              Amp1394Console::Print(iVar10,9,(char *)&local_1308);
              iVar10 = iVar10 + 1;
            } while (iVar5 != iVar10);
          }
          if ((abStack_ff0[*(long *)(local_1010[0] + -0x18)] & 2) == 0) {
            iVar5 = 0x14;
            do {
              local_1298 = 0;
              local_1290 = '\0';
              local_12a0 = &local_1290;
              cVar4 = std::ios::widen((char)*(undefined8 *)(local_1010[0] + -0x18) +
                                      (char)local_1010);
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)local_1010,(string *)&local_12a0,cVar4);
              Amp1394Console::Print(iVar5,9,local_12a0);
              if (local_12a0 != &local_1290) {
                operator_delete(local_12a0,CONCAT71(uStack_128f,local_1290) + 1);
              }
              iVar5 = iVar5 + 1;
            } while ((abStack_ff0[*(long *)(local_1010[0] + -0x18)] & 2) == 0);
            iVar10 = (int)&local_1328 + (int)*(long *)(local_1010[0] + -0x18);
          }
          else {
            iVar10 = (int)&local_1328 + (int)*(long *)(local_1010[0] + -0x18);
            iVar5 = 0x14;
          }
          std::ios::clear(iVar10 + 0x318);
          local_12a0 = &local_1290;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_12a0,"");
          std::__cxx11::stringbuf::str(local_ff8);
          if (local_12a0 != &local_1290) {
            operator_delete(local_12a0,CONCAT71(uStack_128f,local_1290) + 1);
          }
        }
        Amp1394Console::Print(10,10,"Select option: ");
        iVar10 = Amp1394Console::GetChar(&local_1240);
        switch(iVar10) {
        case 0x30:
          bVar3 = true;
          goto LAB_0010a78a;
        case 0x31:
          local_12b8 = 0x2020202020202020;
          uStack_12b0 = 0x20202020202020;
          local_12c8 = 0x2020202020202020;
          uStack_12c0 = 0x2020202020202020;
          local_12d8 = 0x2020202020202020;
          uStack_12d0 = 0x2020202020202020;
          local_12e8 = 0x2020202020202020;
          uStack_12e0 = 0x2020202020202020;
          local_1308.field_2._M_allocated_capacity = 0x2020202020202020;
          local_1308.field_2._8_8_ = 0x2020202020202020;
          local_1308._M_dataplus._M_p = (char *)0x2020202020202020;
          local_1308._M_string_length = 0x2020202020202020;
          uStack_12a9 = 0x20202020;
          local_12a5 = 0;
          iVar10 = 0xc;
          do {
            Amp1394Console::Print(iVar10,9,(char *)&local_1308);
            iVar10 = iVar10 + 1;
          } while (iVar10 != 0x14);
          bVar3 = TestDigitalInputs(0xc,(AmpIO *)local_e88,local_1328,(ofstream *)local_1210,
                                    local_131c);
          pcVar9 = "FAIL";
          if (bVar3) {
            pcVar9 = "PASS";
          }
          iVar10 = 4;
          break;
        case 0x32:
          local_12b8 = 0x2020202020202020;
          uStack_12b0 = 0x20202020202020;
          local_12c8 = 0x2020202020202020;
          uStack_12c0 = 0x2020202020202020;
          local_12d8 = 0x2020202020202020;
          uStack_12d0 = 0x2020202020202020;
          local_12e8 = 0x2020202020202020;
          uStack_12e0 = 0x2020202020202020;
          local_1308.field_2._M_allocated_capacity = 0x2020202020202020;
          local_1308.field_2._8_8_ = 0x2020202020202020;
          local_1308._M_dataplus._M_p = (char *)0x2020202020202020;
          local_1308._M_string_length = 0x2020202020202020;
          uStack_12a9 = 0x20202020;
          local_12a5 = 0;
          iVar10 = 0xc;
          do {
            Amp1394Console::Print(iVar10,9,(char *)&local_1308);
            iVar10 = iVar10 + 1;
          } while (iVar10 != 0x14);
          bVar3 = TestEncoders(0xc,(AmpIO *)local_e88,local_1328,(ofstream *)local_1210,local_131c);
          pcVar9 = "FAIL";
          if (bVar3) {
            pcVar9 = "PASS";
          }
          iVar10 = 5;
          break;
        case 0x33:
          local_12b8 = 0x2020202020202020;
          uStack_12b0 = 0x20202020202020;
          local_12c8 = 0x2020202020202020;
          uStack_12c0 = 0x2020202020202020;
          local_12d8 = 0x2020202020202020;
          uStack_12d0 = 0x2020202020202020;
          local_12e8 = 0x2020202020202020;
          uStack_12e0 = 0x2020202020202020;
          local_1308.field_2._M_allocated_capacity = 0x2020202020202020;
          local_1308.field_2._8_8_ = 0x2020202020202020;
          local_1308._M_dataplus._M_p = (char *)0x2020202020202020;
          local_1308._M_string_length = 0x2020202020202020;
          uStack_12a9 = 0x20202020;
          local_12a5 = 0;
          iVar10 = 0xc;
          do {
            Amp1394Console::Print(iVar10,9,(char *)&local_1308);
            iVar10 = iVar10 + 1;
          } while (iVar10 != 0x14);
          bVar3 = TestAnalogInputs(0xc,(AmpIO *)local_e88,local_1328,(ofstream *)local_1210,
                                   local_131c);
          pcVar9 = "FAIL";
          if (bVar3) {
            pcVar9 = "PASS";
          }
          iVar10 = 6;
          break;
        case 0x34:
          local_12b8 = 0x2020202020202020;
          uStack_12b0 = 0x20202020202020;
          local_12c8 = 0x2020202020202020;
          uStack_12c0 = 0x2020202020202020;
          local_12d8 = 0x2020202020202020;
          uStack_12d0 = 0x2020202020202020;
          local_12e8 = 0x2020202020202020;
          uStack_12e0 = 0x2020202020202020;
          local_1308.field_2._M_allocated_capacity = 0x2020202020202020;
          local_1308.field_2._8_8_ = 0x2020202020202020;
          local_1308._M_dataplus._M_p = (char *)0x2020202020202020;
          local_1308._M_string_length = 0x2020202020202020;
          uStack_12a9 = 0x20202020;
          local_12a5 = 0;
          iVar10 = 0xc;
          do {
            Amp1394Console::Print(iVar10,9,(char *)&local_1308);
            iVar10 = iVar10 + 1;
          } while (iVar10 != 0x14);
          bVar3 = TestMotorPowerControl
                            (0xc,(AmpIO *)local_e88,local_1328,(ofstream *)local_1210,local_131c);
          pcVar9 = "FAIL";
          if (bVar3) {
            pcVar9 = "PASS";
          }
          iVar10 = 7;
          break;
        case 0x35:
          local_12b8 = 0x2020202020202020;
          uStack_12b0 = 0x20202020202020;
          local_12c8 = 0x2020202020202020;
          uStack_12c0 = 0x2020202020202020;
          local_12d8 = 0x2020202020202020;
          uStack_12d0 = 0x2020202020202020;
          local_12e8 = 0x2020202020202020;
          uStack_12e0 = 0x2020202020202020;
          local_1308.field_2._M_allocated_capacity = 0x2020202020202020;
          local_1308.field_2._8_8_ = 0x2020202020202020;
          local_1308._M_dataplus._M_p = (char *)0x2020202020202020;
          local_1308._M_string_length = 0x2020202020202020;
          uStack_12a9 = 0x20202020;
          local_12a5 = 0;
          iVar10 = 0xc;
          do {
            Amp1394Console::Print(iVar10,9,(char *)&local_1308);
            iVar10 = iVar10 + 1;
          } while (iVar10 != 0x14);
          bVar3 = TestPowerAmplifier(0xc,(AmpIO *)local_e88,local_1328,(ofstream *)local_1210,
                                     local_131c);
          pcVar9 = "FAIL";
          if (bVar3) {
            pcVar9 = "PASS";
          }
          iVar10 = 8;
          break;
        case 0x36:
          iVar10 = (*local_1328->_vptr_BasePort[0xf])();
          if (iVar10 == 0) {
            if ((uint)local_1318 < 2) goto switchD_0010a393_default;
          }
          else {
            iVar10 = (*local_1328->_vptr_BasePort[0xf])();
            bVar3 = false;
            if (((uint)local_1318 < 2) || (iVar10 != 3)) goto LAB_0010a78a;
          }
          local_12b8 = 0x2020202020202020;
          uStack_12b0 = 0x20202020202020;
          local_12c8 = 0x2020202020202020;
          uStack_12c0 = 0x2020202020202020;
          local_12d8 = 0x2020202020202020;
          uStack_12d0 = 0x2020202020202020;
          local_12e8 = 0x2020202020202020;
          uStack_12e0 = 0x2020202020202020;
          local_1308.field_2._M_allocated_capacity = 0x2020202020202020;
          local_1308.field_2._8_8_ = 0x2020202020202020;
          local_1308._M_dataplus._M_p = (char *)0x2020202020202020;
          local_1308._M_string_length = 0x2020202020202020;
          uStack_12a9 = 0x20202020;
          local_12a5 = 0;
          row = 0xc;
          iVar10 = (uint)local_1318;
          do {
            curLine = row;
            Amp1394Console::Print(row,9,(char *)&local_1308);
            row = row + 1;
          } while (row != 0x14);
          if (iVar10 == 2) {
            bVar3 = TestEthernetV2(curLine,(AmpIO *)local_e88,Port,(ofstream *)local_1210);
LAB_0010a75f:
            iVar10 = 9;
            pcVar9 = "PASS";
            if (bVar3 != false) break;
          }
          else if (iVar10 == 3) {
            bVar3 = TestEthernetV3(curLine,(AmpIO *)local_e88,Port,(ofstream *)local_1210);
            goto LAB_0010a75f;
          }
          iVar10 = 9;
          pcVar9 = "FAIL";
          break;
        default:
switchD_0010a393_default:
          bVar3 = false;
          goto LAB_0010a78a;
        }
        bVar3 = false;
        Amp1394Console::Print(iVar10,0x2e,pcVar9);
LAB_0010a78a:
        Amp1394Console::Refresh();
      }
      (*local_1328->_vptr_BasePort[0xe])(local_1328,local_1310 & 0xffffffff);
      iVar5 = 0;
      Amp1394Console::End(&local_1240);
    }
    (*local_1328->_vptr_BasePort[0xb])();
    Amp1394Console::End(&local_1240);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to open log file ",0x18);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_1260,local_1258);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    (*local_1328->_vptr_BasePort[0xe])(local_1328,local_1310 & 0xffffffff);
    (*local_1328->_vptr_BasePort[0xb])();
    iVar5 = 0;
  }
  local_1210._0_8_ = _VTT;
  *(undefined8 *)(local_1210 + *(long *)(_VTT->_M_local_buf + -0x18)) = _memcpy;
  std::filebuf::~filebuf((filebuf *)(local_1210 + 8));
  std::ios_base::~ios_base(local_1118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1280._M_dataplus._M_p != &local_1280.field_2) {
    operator_delete(local_1280._M_dataplus._M_p,local_1280.field_2._M_allocated_capacity + 1);
  }
  if (local_1260 != local_1250) {
    operator_delete(local_1260,local_1250[0] + 1);
  }
  AmpIO::~AmpIO((AmpIO *)local_e88);
LAB_0010a853:
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1010);
  std::ios_base::~ios_base(local_f90);
LAB_0010a874:
  if (local_1230 != local_1220) {
    operator_delete(local_1230,local_1220[0] + 1);
  }
  return iVar5;
}

Assistant:

int main(int argc, char** argv)
{
    int i;
    int board = 0;
    unsigned int qlaNum = 0;    // QLA number (1 or 2 for DQLA)

    std::string portDescription = BasePort::DefaultPort();

    if (argc > 1) {
        int args_found = 0;
        for (i = 1; i < argc; i++) {
            if (argv[i][0] == '-') {
                if (argv[i][1] == 'p') {
                    portDescription = argv[i]+2;
                }
                else if (argv[i][1] == 'q') {
                    qlaNum = argv[i][2]-'0';
                }
                else {
                    std::cerr << "Usage: qlatest [<board-num>] [-pP] [-qN]" << std::endl
                    << "       where <board-num> = rotary switch setting (0-15, default 0)" << std::endl
                    << "             P = port number (default 0)" << std::endl
                    << "                 can also specify -pfwP, -pethP or -pudp" << std::endl
                    << "             N = QLA number (1 or 2) on DQLA" << std::endl;
                    return 0;
                }
            }
            else {
                if (args_found == 0) {
                    board = atoi(argv[i]);
                    std::cerr << "Selecting board " << board << std::endl;
                }
                args_found++;
            }
        }
    }

    std::stringstream debugStream(std::stringstream::out|std::stringstream::in);
    BasePort *Port = PortFactory(portDescription.c_str(), debugStream);
    if (!Port) {
        PrintDebugStream(debugStream);
        std::cerr << "Failed to create port using: " << portDescription << std::endl;
        return -1;
    }
    if (!Port->IsOK()) {
        PrintDebugStream(debugStream);
        std::cerr << "Failed to initialize " << Port->GetPortTypeString() << std::endl;
        return -1;
    }

    bool isDQLA = (Port->GetHardwareVersion(board) == DQLA_String);
    if (isDQLA) {
        if (!((qlaNum == 1) || (qlaNum == 2))) {
            std::cerr << "Must specify -q1 or -q2 to select QLA number for DQLA" << std::endl;
            delete Port;
            return 0;
        }
    }
    else if (qlaNum != 0) {
        // If not DQLA, force qlaNum to 0
        qlaNum = 0;
    }

    AmpIO Board(board);
    Port->AddBoard(&Board);

    std::string logFilename("QLA_");
    std::string QLA_SN = Board.GetQLASerialNumber(qlaNum);
    if (QLA_SN.empty()) {
        std::cerr << "QLA serial number not found. Program now (y/n)? ";
#ifdef _MSC_VER
        char resp = _getch();
#else
        char resp = getchar();
#endif
        std::cerr << std::endl;
        if ((resp == 'y') || (resp == 'Y')) {
            if (PromQLASerialNumberProgram(Board, qlaNum))
                QLA_SN = Board.GetQLASerialNumber(qlaNum);
            else
                std::cerr << "Failed to program QLA serial number" << std::endl;
        }
        if (QLA_SN.empty()) {
            QLA_SN.assign("Unknown");
        }
    }
    logFilename.append(QLA_SN);
    logFilename.append(".log");
    std::ofstream logFile(logFilename.c_str());
    if (!logFile.good()) {
        std::cerr << "Failed to open log file " << logFilename << std::endl;
        Port->RemoveBoard(board);
        delete Port;
        return 0;
    }
    logFile << "====== TEST REPORT ======" << std::endl << std::endl;
    logFile << "QLA S/N: " << QLA_SN;
    if (qlaNum != 0)
        logFile << " (QLA " << qlaNum << " of DQLA)";
    logFile << std::endl;

    unsigned int fpgaVer = Board.GetFpgaVersionMajor();
    if (fpgaVer == 3) {
        logFile << "FPGA V3" << std::endl;
    }
    else {
        std::string FPGA_SN = Board.GetFPGASerialNumber();
        if (FPGA_SN.empty())
            FPGA_SN.assign("Unknown");
        logFile << "FPGA S/N: " << FPGA_SN << std::endl;
    }

    logFile << "FPGA Firmware Version: " << Board.GetFirmwareVersion() << std::endl;

    Amp1394Console console(Amp1394Console::FLAG_ECHO|Amp1394Console::FLAG_BLOCKING);
    console.Init();
    if (!console.IsOK()) {
        std::cerr << "Failed to initialize console" << std::endl;
        Port->RemoveBoard(board);
        delete Port;
        return -1;
    }

    console.Print(1, 9, "QLA Test for Board %d, S/N %s", board, QLA_SN.c_str());

    console.Print(3, 9, "0) Quit");
    console.Print(4, 9, "1) Test digital input:");
    console.Print(5, 9, "2) Test encoder feedback:");
    console.Print(6, 9, "3) Test analog feedback:");
    console.Print(7, 9, "4) Test motor power control:");
    console.Print(8, 9, "5) Test power amplifier:");   // includes current feedback & temp sense
    if (((Port->GetPortType() == BasePort::PORT_FIREWIRE) ||
         (Port->GetPortType() == BasePort::PORT_ZYNQ_EMIO)) && (fpgaVer > 1))
        console.Print(9, 9, "6) Test Ethernet controller:");

    console.Refresh();

    const int TEST_START_LINE = 12;
    const int DEBUG_START_LINE = 20;
    int last_debug_line = DEBUG_START_LINE;

    bool done = false;
    while (!done) {

        if (!debugStream.str().empty()) {
            int cur_line = DEBUG_START_LINE;
            char line[80];
            memset(line, ' ', sizeof(line));
            for (i = cur_line; i < last_debug_line; i++)
                console.Print(i, 9, line);
            while (!debugStream.eof()) {
                std::string stringLine;
                std::getline(debugStream, stringLine);
                console.Print(cur_line++, 9, stringLine.c_str());
            }
            debugStream.clear();
            debugStream.str("");
            last_debug_line = cur_line;
        }

        console.Print(10, 10, "Select option: ");
        int c = console.GetChar();

        switch (c) {
            case '0':   // Quit
                done = true;
                break;
            case '1':   // Test digital input
                ClearLines(TEST_START_LINE, DEBUG_START_LINE);
                if (TestDigitalInputs(TEST_START_LINE, Board, Port, logFile, qlaNum))
                    console.Print(4, 46, "PASS");
                else
                    console.Print(4, 46, "FAIL");
                break;

            case '2':    // Test encoder feedback
                ClearLines(TEST_START_LINE, DEBUG_START_LINE);
                if (TestEncoders(TEST_START_LINE, Board, Port, logFile, qlaNum))
                    console.Print(5, 46, "PASS");
                else
                    console.Print(5, 46, "FAIL");
                break;

            case '3':    // Test analog feedback
                ClearLines(TEST_START_LINE, DEBUG_START_LINE);
                if (TestAnalogInputs(TEST_START_LINE, Board, Port, logFile, qlaNum))
                    console.Print(6, 46, "PASS");
                else
                    console.Print(6, 46, "FAIL");
                break;

            case '4':
                ClearLines(TEST_START_LINE, DEBUG_START_LINE);
                if (TestMotorPowerControl(TEST_START_LINE, Board, Port, logFile, qlaNum))
                    console.Print(7, 46, "PASS");
                else
                    console.Print(7, 46, "FAIL");
                break;

            case '5':
                ClearLines(TEST_START_LINE, DEBUG_START_LINE);
                if (TestPowerAmplifier(TEST_START_LINE, Board, Port, logFile, qlaNum))
                    console.Print(8, 46, "PASS");
                else
                    console.Print(8, 46, "FAIL");
                break;

            case '6':
                 if (((Port->GetPortType() == BasePort::PORT_FIREWIRE) ||
                      (Port->GetPortType() == BasePort::PORT_ZYNQ_EMIO)) && (fpgaVer > 1)) {
                    ClearLines(TEST_START_LINE, DEBUG_START_LINE);
                    if ((fpgaVer == 2) && TestEthernetV2(TEST_START_LINE, Board, Port, logFile))
                        console.Print(9, 46, "PASS");
                    else if ((fpgaVer == 3) && TestEthernetV3(TEST_START_LINE, Board, Port, logFile))
                        console.Print(9, 46, "PASS");
                    else
                        console.Print(9, 46, "FAIL");
                }
                break;

        }

        console.Refresh();
    }

    Port->RemoveBoard(board);
    console.End();
    delete Port;
}